

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O2

void av1_compute_stats_highbd_sse4_1
               (int wiener_win,uint8_t *dgd8,uint8_t *src8,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,aom_bit_depth_t bit_depth)

{
  uint16_t *puVar1;
  int *piVar2;
  long *plVar3;
  uint16_t *puVar4;
  ushort uVar5;
  ushort uVar6;
  uint16_t uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int64_t (*paiVar21) [56];
  int64_t *piVar22;
  int64_t *piVar23;
  int64_t *piVar24;
  int iVar25;
  ulong uVar26;
  int64_t *piVar27;
  int32_t *piVar28;
  long lVar29;
  long lVar30;
  int64_t (*paiVar31) [7];
  int32_t *piVar32;
  long lVar33;
  long lVar34;
  int64_t *piVar35;
  int32_t *local_59e8;
  int64_t *local_59d8;
  long local_5958;
  long local_5950;
  int64_t *local_5920;
  long local_5910;
  long local_5908;
  long local_5900;
  long local_58f8;
  __m128i dgd_ijkl;
  long local_5898;
  long local_5890;
  longlong local_5878 [3];
  long local_5860;
  int32_t sumY [7] [7];
  int64_t M_int [7] [7];
  int64_t H_int [49] [56];
  
  local_5920 = H;
  lVar11 = (long)dgd_stride;
  if (wiener_win == 5) {
    puVar4 = (uint16_t *)((long)dgd8 * 2);
    uVar7 = find_average_highbd(puVar4,h_start,h_end,v_start,v_end,dgd_stride);
    iVar10 = 0;
    memset(M_int,0,200);
    memset(H_int,0,8000);
    sumY[2][6] = 0;
    sumY[3][0] = 0;
    sumY[3][1] = 0;
    sumY[3][2] = 0;
    sumY[2][2] = 0;
    sumY[2][3] = 0;
    sumY[2][4] = 0;
    sumY[2][5] = 0;
    sumY[1][5] = 0;
    sumY[1][6] = 0;
    sumY[2][0] = 0;
    sumY[2][1] = 0;
    sumY[1][1] = 0;
    sumY[1][2] = 0;
    sumY[1][3] = 0;
    sumY[1][4] = 0;
    sumY[3][3] = 0;
    sumY[0][4] = 0;
    sumY[0][5] = 0;
    sumY[0][6] = 0;
    sumY[1][0] = 0;
    sumY[0][0] = 0;
    sumY[0][1] = 0;
    sumY[0][2] = 0;
    sumY[0][3] = 0;
    lVar12 = (long)(dgd_stride * 2);
    local_5878[0] = 0x504030203020100;
    local_5878[1] = 0x908070607060504;
    lVar29 = (long)v_start;
    local_5908 = (long)h_start * 2 + lVar11 * lVar29 * 2 + lVar12 * -2 + (long)dgd8 * 2 + -4;
    lVar19 = lVar11 * 2;
    local_5910 = lVar11 * lVar29 * 2 + lVar12 * -2 + (long)dgd8 * 2 + -4;
    while( true ) {
      iVar25 = (int)lVar29;
      iVar8 = v_end - iVar25;
      if (iVar8 == 0 || v_end < iVar25) break;
      if (0x3f < iVar8) {
        iVar8 = 0x40;
      }
      local_5958 = local_5910;
      local_5950 = local_5908;
      for (lVar18 = lVar29; lVar18 < iVar8 + iVar25; lVar18 = lVar18 + 1) {
        lVar16 = (long)src8 * 2 + lVar18 * src_stride * 2;
        lVar34 = local_5950;
        iVar15 = h_start;
        for (lVar17 = (long)h_start; lVar17 < (int)(h_end & 0xfffffffe); lVar17 = lVar17 + 2) {
          uVar14 = (uint)*(ushort *)(lVar16 + lVar17 * 2);
          uVar9 = (uint)*(ushort *)(lVar16 + 2 + lVar17 * 2);
          puVar1 = puVar4 + ((lVar18 * lVar11 + lVar17 + -2) - lVar12);
          piVar22 = H_int[0];
          local_59e8 = sumY[0];
          local_59d8 = M_int[0];
          lVar33 = lVar34;
          for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
            lVar30 = 0;
            for (lVar20 = 0; lVar20 != 8000; lVar20 = lVar20 + 0x640) {
              uVar5 = *(ushort *)(lVar33 + lVar30);
              uVar6 = *(ushort *)(lVar33 + 2 + lVar30);
              piVar2 = (int *)((long)local_59e8 + lVar30 * 2);
              *piVar2 = *piVar2 + (uint)uVar6 + (uint)uVar5;
              plVar3 = (long *)((long)local_59d8 + lVar30 * 4);
              *plVar3 = *plVar3 + (ulong)(uVar6 * uVar9 + uVar5 * uVar14);
              dgd_ijkl[0]._4_4_ = *(undefined4 *)(lVar33 + lVar30);
              dgd_ijkl[0]._0_4_ = dgd_ijkl[0]._4_4_;
              dgd_ijkl[1]._0_4_ = dgd_ijkl[0]._4_4_;
              dgd_ijkl[1]._4_4_ = dgd_ijkl[0]._4_4_;
              acc_stat_highbd_sse41
                        ((int64_t *)((long)piVar22 + lVar20),puVar1,(__m128i *)local_5878,&dgd_ijkl)
              ;
              acc_stat_highbd_sse41
                        ((int64_t *)((long)piVar22 + lVar20 + 0x40),puVar1 + lVar11,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)piVar22 + lVar20 + 0x80),puVar1 + lVar12,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)piVar22 + lVar20 + 0xc0),puVar1 + dgd_stride * 3,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)piVar22 + lVar20 + 0x100),puVar1 + dgd_stride * 4,
                         (__m128i *)local_5878,&dgd_ijkl);
              lVar30 = lVar30 + 2;
            }
            local_59d8 = local_59d8 + 5;
            local_59e8 = local_59e8 + 5;
            lVar33 = lVar33 + lVar19;
            piVar22 = piVar22 + 0x28;
          }
          iVar10 = iVar10 + uVar14 + uVar9;
          lVar34 = lVar34 + 4;
          iVar15 = iVar15 + 2;
        }
        if ((h_end & 1U) != 0) {
          uVar9 = (uint)*(ushort *)(lVar16 + (long)(int)lVar17 * 2);
          puVar1 = puVar4 + ((lVar18 * lVar11 + (long)(int)lVar17 + -2) - lVar12);
          local_59e8 = (int32_t *)(local_5958 + (long)iVar15 * 2);
          piVar22 = H_int[0];
          local_59d8 = (int64_t *)sumY;
          piVar23 = M_int[0];
          for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
            lVar17 = 0;
            for (lVar34 = 0; lVar34 != 8000; lVar34 = lVar34 + 0x640) {
              uVar5 = *(ushort *)((long)local_59e8 + lVar17);
              piVar2 = (int *)((long)local_59d8 + lVar17 * 2);
              *piVar2 = *piVar2 + (uint)uVar5;
              plVar3 = (long *)((long)piVar23 + lVar17 * 4);
              *plVar3 = *plVar3 + (ulong)(uVar5 * uVar9);
              dgd_ijkl[0] = (longlong)CONCAT24(uVar5,(uint)uVar5);
              dgd_ijkl[1]._0_2_ = uVar5;
              dgd_ijkl[1]._2_2_ = 0;
              dgd_ijkl[1]._4_2_ = uVar5;
              dgd_ijkl[1]._6_2_ = 0;
              acc_stat_highbd_sse41
                        ((int64_t *)((long)piVar22 + lVar34),puVar1,(__m128i *)local_5878,&dgd_ijkl)
              ;
              acc_stat_highbd_sse41
                        ((int64_t *)((long)piVar22 + lVar34 + 0x40),puVar1 + lVar11,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)piVar22 + lVar34 + 0x80),puVar1 + lVar12,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)piVar22 + lVar34 + 0xc0),puVar1 + dgd_stride * 3,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)piVar22 + lVar34 + 0x100),puVar1 + dgd_stride * 4,
                         (__m128i *)local_5878,&dgd_ijkl);
              lVar17 = lVar17 + 2;
            }
            piVar23 = piVar23 + 5;
            local_59d8 = (int64_t *)((long)local_59d8 + 0x14);
            local_59e8 = (int32_t *)((long)local_59e8 + lVar19);
            piVar22 = piVar22 + 0x28;
          }
          iVar10 = iVar10 + uVar9;
        }
        local_5950 = local_5950 + lVar19;
        local_5958 = local_5958 + lVar19;
      }
      lVar29 = lVar29 + 0x40;
      local_5908 = local_5908 + lVar11 * 0x80;
      local_5910 = local_5910 + lVar11 * 0x80;
    }
    lVar11 = 0x10;
    if (bit_depth != AOM_BITS_12) {
      lVar11 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
    }
    uVar26 = (ulong)uVar7;
    lVar12 = uVar26 * uVar26 * (long)((h_end - h_start) * (v_end - v_start));
    piVar22 = H_int[0];
    for (lVar19 = 0; lVar19 != 5; lVar19 = lVar19 + 1) {
      piVar23 = local_5920;
      piVar27 = piVar22;
      for (lVar29 = 0; lVar29 != 5; lVar29 = lVar29 + 1) {
        iVar8 = sumY[0][lVar19 * 5 + lVar29];
        M[lVar29 * 5 + lVar19] =
             (long)((M_int[0][lVar19 * 5 + lVar29] + lVar12) - ((long)iVar10 + (long)iVar8) * uVar26
                   ) / lVar11;
        piVar28 = sumY[0];
        piVar24 = piVar23;
        piVar35 = piVar27;
        for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
          piVar32 = piVar28;
          for (lVar16 = 0; lVar16 != 0x28; lVar16 = lVar16 + 8) {
            *(long *)((long)piVar24 + lVar16) =
                 (long)((piVar35[lVar16] + lVar12) - ((long)*piVar32 + (long)iVar8) * uVar26) /
                 lVar11;
            piVar32 = piVar32 + 5;
          }
          piVar35 = piVar35 + 1;
          piVar24 = piVar24 + 5;
          piVar28 = piVar28 + 1;
        }
        piVar27 = piVar27 + 200;
        piVar23 = piVar23 + 0x7d;
      }
      piVar22 = piVar22 + 0x28;
      local_5920 = local_5920 + 0x19;
    }
  }
  else {
    if (wiener_win != 7) {
      av1_compute_stats_highbd_c
                (wiener_win,dgd8,src8,dgd_avg,src_avg,h_start,h_end,v_start,v_end,dgd_stride,
                 src_stride,M,H,bit_depth);
      return;
    }
    lVar29 = (long)v_start;
    puVar4 = (uint16_t *)((long)dgd8 * 2);
    uVar7 = find_average_highbd(puVar4,h_start,h_end,v_start,v_end,dgd_stride);
    iVar10 = 0;
    memset(M_int,0,0x188);
    memset(H_int,0,0x55c0);
    memset(sumY,0,0xc4);
    lVar12 = (long)(dgd_stride * 3);
    local_5878[0] = 0x504030203020100;
    local_5878[1] = 0x908070607060504;
    local_5890 = (long)h_start * 2 + lVar11 * lVar29 * 2 + lVar12 * -2 + (long)dgd8 * 2 + -6;
    local_5860 = lVar11 << 7;
    lVar19 = lVar11 * 2;
    local_5898 = lVar11 * lVar29 * 2 + lVar12 * -2 + (long)dgd8 * 2 + -6;
    while( true ) {
      iVar25 = (int)lVar29;
      iVar8 = v_end - iVar25;
      if (iVar8 == 0 || v_end < iVar25) break;
      if (0x3f < iVar8) {
        iVar8 = 0x40;
      }
      local_5900 = local_5898;
      local_58f8 = local_5890;
      for (lVar18 = lVar29; lVar18 < iVar8 + iVar25; lVar18 = lVar18 + 1) {
        lVar16 = (long)src8 * 2 + lVar18 * src_stride * 2;
        lVar34 = local_58f8;
        iVar15 = h_start;
        for (lVar17 = (long)h_start; lVar17 < (int)(h_end & 0xfffffffe); lVar17 = lVar17 + 2) {
          uVar14 = (uint)*(ushort *)(lVar16 + lVar17 * 2);
          uVar9 = (uint)*(ushort *)(lVar16 + 2 + lVar17 * 2);
          puVar1 = puVar4 + ((lVar18 * lVar11 + lVar17 + -3) - lVar12);
          paiVar21 = H_int;
          local_59e8 = sumY[0];
          local_59d8 = M_int[0];
          lVar33 = lVar34;
          for (lVar13 = 0; lVar13 != 7; lVar13 = lVar13 + 1) {
            lVar20 = 0;
            for (lVar30 = 0; lVar30 != 0x55c0; lVar30 = lVar30 + 0xc40) {
              uVar5 = *(ushort *)(lVar33 + lVar20);
              uVar6 = *(ushort *)(lVar33 + 2 + lVar20);
              piVar2 = (int *)((long)local_59e8 + lVar20 * 2);
              *piVar2 = *piVar2 + (uint)uVar6 + (uint)uVar5;
              plVar3 = (long *)((long)local_59d8 + lVar20 * 4);
              *plVar3 = *plVar3 + (ulong)(uVar6 * uVar9 + uVar5 * uVar14);
              dgd_ijkl[0]._4_4_ = *(undefined4 *)(lVar33 + lVar20);
              dgd_ijkl[0]._0_4_ = dgd_ijkl[0]._4_4_;
              dgd_ijkl[1]._0_4_ = dgd_ijkl[0]._4_4_;
              dgd_ijkl[1]._4_4_ = dgd_ijkl[0]._4_4_;
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar30),puVar1,(__m128i *)local_5878,
                         &dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar30 + 0x40),puVar1 + lVar11,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar30 + 0x80),puVar1 + dgd_stride * 2,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar30 + 0xc0),puVar1 + lVar12,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar30 + 0x100),puVar1 + dgd_stride * 4,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar30 + 0x140),puVar1 + dgd_stride * 5,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar30 + 0x180),puVar1 + dgd_stride * 6,
                         (__m128i *)local_5878,&dgd_ijkl);
              lVar20 = lVar20 + 2;
            }
            local_59d8 = (int64_t *)((long)local_59d8 + 0x38);
            local_59e8 = (int32_t *)((long)local_59e8 + 0x1c);
            lVar33 = lVar33 + lVar19;
            paiVar21 = paiVar21 + 1;
          }
          iVar10 = iVar10 + uVar14 + uVar9;
          lVar34 = lVar34 + 4;
          iVar15 = iVar15 + 2;
        }
        if ((h_end & 1U) != 0) {
          uVar9 = (uint)*(ushort *)(lVar16 + (long)(int)lVar17 * 2);
          puVar1 = puVar4 + ((lVar18 * lVar11 + (long)(int)lVar17 + -3) - lVar12);
          local_59e8 = (int32_t *)(local_5900 + (long)iVar15 * 2);
          paiVar21 = H_int;
          local_59d8 = (int64_t *)sumY;
          paiVar31 = M_int;
          for (lVar16 = 0; lVar16 != 7; lVar16 = lVar16 + 1) {
            lVar34 = 0;
            for (lVar17 = 0; lVar17 != 0x55c0; lVar17 = lVar17 + 0xc40) {
              uVar5 = *(ushort *)((long)local_59e8 + lVar34);
              piVar2 = (int *)((long)(int32_t *)local_59d8 + lVar34 * 2);
              *piVar2 = *piVar2 + (uint)uVar5;
              plVar3 = (long *)((long)*paiVar31 + lVar34 * 4);
              *plVar3 = *plVar3 + (ulong)(uVar5 * uVar9);
              dgd_ijkl[0] = (longlong)CONCAT24(uVar5,(uint)uVar5);
              dgd_ijkl[1]._0_2_ = uVar5;
              dgd_ijkl[1]._2_2_ = 0;
              dgd_ijkl[1]._4_2_ = uVar5;
              dgd_ijkl[1]._6_2_ = 0;
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar17),puVar1,(__m128i *)local_5878,
                         &dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar17 + 0x40),puVar1 + lVar11,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar17 + 0x80),puVar1 + dgd_stride * 2,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar17 + 0xc0),puVar1 + lVar12,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar17 + 0x100),puVar1 + dgd_stride * 4,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar17 + 0x140),puVar1 + dgd_stride * 5,
                         (__m128i *)local_5878,&dgd_ijkl);
              acc_stat_highbd_sse41
                        ((int64_t *)((long)*paiVar21 + lVar17 + 0x180),puVar1 + dgd_stride * 6,
                         (__m128i *)local_5878,&dgd_ijkl);
              lVar34 = lVar34 + 2;
            }
            paiVar31 = paiVar31 + 1;
            local_59d8 = (int64_t *)((long)local_59d8 + 0x1c);
            local_59e8 = (int32_t *)((long)local_59e8 + lVar19);
            paiVar21 = paiVar21 + 1;
          }
          iVar10 = iVar10 + uVar9;
        }
        local_58f8 = local_58f8 + lVar19;
        local_5900 = local_5900 + lVar19;
      }
      lVar29 = lVar29 + 0x40;
      local_5890 = local_5890 + local_5860;
      local_5898 = local_5898 + local_5860;
    }
    lVar11 = 0x10;
    if (bit_depth != AOM_BITS_12) {
      lVar11 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
    }
    uVar26 = (ulong)uVar7;
    lVar12 = uVar26 * uVar26 * (long)((h_end - h_start) * (v_end - v_start));
    piVar22 = H_int[0];
    for (lVar19 = 0; lVar19 != 7; lVar19 = lVar19 + 1) {
      piVar23 = local_5920;
      piVar27 = piVar22;
      for (lVar29 = 0; lVar29 != 7; lVar29 = lVar29 + 1) {
        iVar8 = sumY[lVar19][lVar29];
        M[lVar29 * 7 + lVar19] =
             (long)((M_int[lVar19][lVar29] + lVar12) - ((long)iVar10 + (long)iVar8) * uVar26) /
             lVar11;
        piVar28 = sumY[0];
        piVar24 = piVar23;
        piVar35 = piVar27;
        for (lVar18 = 0; lVar18 != 7; lVar18 = lVar18 + 1) {
          piVar32 = piVar28;
          for (lVar16 = 0; lVar16 != 0x38; lVar16 = lVar16 + 8) {
            *(long *)((long)piVar24 + lVar16) =
                 (long)((piVar35[lVar16] + lVar12) - ((long)*piVar32 + (long)iVar8) * uVar26) /
                 lVar11;
            piVar32 = piVar32 + 7;
          }
          piVar35 = piVar35 + 1;
          piVar24 = piVar24 + 7;
          piVar28 = piVar28 + 1;
        }
        piVar27 = piVar27 + 0x188;
        piVar23 = piVar23 + 0x157;
      }
      piVar22 = piVar22 + 0x38;
      local_5920 = local_5920 + 0x31;
    }
  }
  return;
}

Assistant:

void av1_compute_stats_highbd_sse4_1(int wiener_win, const uint8_t *dgd8,
                                     const uint8_t *src8, int16_t *dgd_avg,
                                     int16_t *src_avg, int h_start, int h_end,
                                     int v_start, int v_end, int dgd_stride,
                                     int src_stride, int64_t *M, int64_t *H,
                                     aom_bit_depth_t bit_depth) {
  if (wiener_win == WIENER_WIN) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win7_opt_sse4_1(dgd8, src8, h_start, h_end, v_start,
                                         v_end, dgd_stride, src_stride, M, H,
                                         bit_depth);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    (void)dgd_avg;
    (void)src_avg;
    compute_stats_highbd_win5_opt_sse4_1(dgd8, src8, h_start, h_end, v_start,
                                         v_end, dgd_stride, src_stride, M, H,
                                         bit_depth);
  } else {
    av1_compute_stats_highbd_c(wiener_win, dgd8, src8, dgd_avg, src_avg,
                               h_start, h_end, v_start, v_end, dgd_stride,
                               src_stride, M, H, bit_depth);
  }
}